

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_port.c
# Opt level: O3

int csp_bind(csp_socket_t *socket,uint8_t port)

{
  int iVar1;
  
  iVar1 = -2;
  if (socket != (csp_socket_t *)0x0) {
    if (port == 0xff) {
      port = 0x11;
    }
    else if (0x10 < port) {
      csp_dbg_errno = '\b';
      return -2;
    }
    if (ports[port].state != PORT_CLOSED) {
      csp_dbg_errno = '\t';
      return -4;
    }
    ports[port].field_1.socket = socket;
    ports[port].state = PORT_OPEN;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int csp_bind(csp_socket_t * socket, uint8_t port) {

	if (socket == NULL)
		return CSP_ERR_INVAL;

	if (port == CSP_ANY) {
		port = CSP_PORT_MAX_BIND + 1;
	} else if (port > CSP_PORT_MAX_BIND) {
		csp_dbg_errno = CSP_DBG_ERR_INVALID_BIND_PORT;
		return CSP_ERR_INVAL;
	}

	if (ports[port].state != PORT_CLOSED) {
		csp_dbg_errno = CSP_DBG_ERR_PORT_ALREADY_IN_USE;
		return CSP_ERR_USED;
	}

	/* Save listener */
	ports[port].socket = socket;
	ports[port].state = PORT_OPEN;

	return CSP_ERR_NONE;
}